

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O3

void __thiscall APITests::print_info(APITests *this)

{
  char *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"==========================",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[Library Version] ",0x12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"1.2.5",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[Model] ",8);
  pcVar1 = GPIO::LazyString::operator_cast_to_char_((LazyString *)&GPIO::model);
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x11f288);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  pcVar1 = GPIO::LazyString::operator_cast_to_char_((LazyString *)&GPIO::JETSON_INFO);
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x11f288);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"==========================",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[NOTE]",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"For this test script to run correctly, ",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"you must connect a wire between",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"the pin the test uses for output(BOARD pin ",0x2b);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(this->pin_data).out_a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," and the pin the test uses for input(BOARD pin ",0x2f);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(this->pin_data).in_a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,").",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"==========================",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  return;
}

Assistant:

void print_info()
    {
        const auto line = "==========================";

        std::cout << line << std::endl;
        std::cout << "[Library Version] " << GPIO::VERSION << std::endl;
        std::cout << "[Model] " << GPIO::model << std::endl;
        std::cout << GPIO::JETSON_INFO;
        std::cout << line << std::endl;

        std::cout << "[NOTE]" << std::endl;
        std::cout << "For this test script to run correctly, ";
        std::cout << "you must connect a wire between" << std::endl;
        std::cout << "the pin the test uses for output(BOARD pin ";
        std::cout << pin_data.out_a << ")";
        std::cout << " and the pin the test uses for input(BOARD pin " << pin_data.in_a << ").";
        std::cout << std::endl;

        std::cout << line << std::endl;
    }